

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::GatherBase::Verify(GatherBase *this)

{
  byte *pixels;
  value_type_conflict5 *__val;
  long lVar1;
  
  pixels = (byte *)operator_new(4);
  pixels[0] = 0;
  pixels[1] = 0;
  pixels[2] = 0;
  pixels[3] = 0;
  glu::CallLogWrapper::glReadPixels
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0,0,1,1,
             0x1908,0x1401,pixels);
  if ((((*pixels == 0) && (pixels[1] == 0xff)) && (pixels[2] == 0)) && (pixels[3] == 0xff)) {
    lVar1 = 0;
  }
  else {
    lVar1 = -1;
    anon_unknown_0::Output
              ("Expected Vec4(0, 255, 0, 255), got: %d, %d, %d, %d",(ulong)*pixels,(ulong)pixels[1],
               (ulong)pixels[2],(ulong)pixels[3]);
  }
  operator_delete(pixels,4);
  return lVar1;
}

Assistant:

virtual long Verify()
	{
		std::vector<GLubyte> data(4);
		glReadPixels(0, 0, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
		if (data[0] != 0 || data[1] != 255 || data[2] != 0 || data[3] != 255)
		{
			Output("Expected Vec4(0, 255, 0, 255), got: %d, %d, %d, %d", data[0], data[1], data[2], data[3]);
			return ERROR;
		}
		return NO_ERROR;
	}